

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Teleport_NoFog(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  uint flags;
  bool bVar1;
  uint uVar2;
  
  if (arg1 == 3) {
    uVar2 = 0x44;
  }
  else {
    if (arg1 != 2) {
      uVar2 = 0;
      if (arg1 == 0) {
        uVar2 = 4;
      }
      goto LAB_00533cb6;
    }
    uVar2 = 0x24;
  }
  if (ln == (line_t *)0x0) {
    uVar2 = 0;
  }
LAB_00533cb6:
  flags = uVar2 | 0x10;
  if (arg3 == 0) {
    flags = uVar2;
  }
  bVar1 = EV_Teleport(arg0,arg2,ln,(uint)backSide,it,flags);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Teleport_NoFog)
// Teleport_NoFog (tid, useang, sectortag, keepheight)
{
	int flags = 0;
	switch (arg1)
	{
	case 0:
		flags |= TELF_KEEPORIENTATION;
		break;

	default:
	case 1:
		break;

	case 2:
		if (ln != NULL) flags |= TELF_KEEPORIENTATION | TELF_ROTATEBOOM;	// adjust to exit thing like Boom (i.e. with incorrect reversed angle)
		break;

	case 3:
		if (ln != NULL) flags |= TELF_KEEPORIENTATION | TELF_ROTATEBOOMINVERSE;	// adjust to exit thing correctly
		break;
	}

	if (arg3)
	{
		flags |= TELF_KEEPHEIGHT;
	}
	return EV_Teleport (arg0, arg2, ln, backSide, it, flags);
}